

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Block.cpp
# Opt level: O2

PSNodesBlock * __thiscall
dg::pta::LLVMPointerGraphBuilder::buildPointerGraphBlock
          (PSNodesBlock *__return_storage_ptr__,LLVMPointerGraphBuilder *this,BasicBlock *block,
          PointerSubgraph *parent)

{
  pointer ppPVar1;
  bool bVar2;
  PSNodesSeq *__range3;
  PSNodesSeq *s;
  pointer ppPVar3;
  BasicBlock *pBVar4;
  BasicBlock *Inst;
  
  (__return_storage_ptr__->_nodes).
  super__Vector_base<dg::pta::LLVMPointerGraphBuilder::PSNodesSeq_*,_std::allocator<dg::pta::LLVMPointerGraphBuilder::PSNodesSeq_*>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (__return_storage_ptr__->_nodes).
  super__Vector_base<dg::pta::LLVMPointerGraphBuilder::PSNodesSeq_*,_std::allocator<dg::pta::LLVMPointerGraphBuilder::PSNodesSeq_*>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->_nodes).
  super__Vector_base<dg::pta::LLVMPointerGraphBuilder::PSNodesSeq_*,_std::allocator<dg::pta::LLVMPointerGraphBuilder::PSNodesSeq_*>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  for (pBVar4 = block + 0x30; pBVar4 = *(BasicBlock **)pBVar4, pBVar4 != block + 0x28;
      pBVar4 = pBVar4 + 8) {
    Inst = pBVar4 + -0x18;
    if (pBVar4 == (BasicBlock *)0x0) {
      Inst = (BasicBlock *)0x0;
    }
    bVar2 = isRelevantInstruction(this,(Instruction *)Inst);
    if (bVar2) {
      s = buildInstruction(this,(Instruction *)Inst);
      ppPVar1 = (s->_nodes).
                super__Vector_base<dg::pta::PSNode_*,_std::allocator<dg::pta::PSNode_*>_>._M_impl.
                super__Vector_impl_data._M_finish;
      for (ppPVar3 = (s->_nodes).
                     super__Vector_base<dg::pta::PSNode_*,_std::allocator<dg::pta::PSNode_*>_>.
                     _M_impl.super__Vector_impl_data._M_start; ppPVar3 != ppPVar1;
          ppPVar3 = ppPVar3 + 1) {
        (*ppPVar3)->_parent = parent;
      }
      PSNodesBlock::append(__return_storage_ptr__,s);
    }
    else {
      bVar2 = llvm::MemSetInst::classof((Value *)Inst);
      if (bVar2) {
        checkMemSet(this,(Instruction *)Inst);
      }
    }
  }
  return __return_storage_ptr__;
}

Assistant:

LLVMPointerGraphBuilder::PSNodesBlock
LLVMPointerGraphBuilder::buildPointerGraphBlock(const llvm::BasicBlock &block,
                                                PointerSubgraph *parent) {
    PSNodesBlock blk;

    for (const llvm::Instruction &Inst : block) {
        if (!isRelevantInstruction(Inst)) {
            // check if it is a zeroing of memory,
            // if so, set the corresponding memory to zeroed
            if (llvm::isa<llvm::MemSetInst>(&Inst))
                checkMemSet(&Inst);

            continue;
        }

        assert(nodes_map.count(&Inst) == 0 && "Already built this instruction");
        auto &seq = buildInstruction(Inst);

        // set parent to the new nodes
        for (auto *nd : seq) {
            nd->setParent(parent);
        }

        blk.append(&seq);
    }

    return blk;
}